

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_rawgeti(lua_State *L,int idx,lua_Integer n)

{
  byte bVar1;
  Table *t;
  
  t = gettable(L,idx);
  if (n - 1U < (ulong)t->asize) {
    bVar1 = *(byte *)((long)t->array + n + 3);
    if ((bVar1 & 0xf) != 0) {
      *(byte *)((L->top).offset + 8) = bVar1;
      (((L->top).p)->val).value_ = t->array[-n];
    }
  }
  else {
    bVar1 = luaH_getint(t,n,&((L->top).p)->val);
  }
  if ((bVar1 & 0xf) == 0) {
    *(undefined1 *)((L->top).offset + 8) = 0;
  }
  (L->top).p = (StkId)((L->top).offset + 0x10);
  return (int)(bVar1 & 0xf);
}

Assistant:

LUA_API int lua_rawgeti (lua_State *L, int idx, lua_Integer n) {
  Table *t;
  lu_byte tag;
  lua_lock(L);
  t = gettable(L, idx);
  luaH_fastgeti(t, n, s2v(L->top.p), tag);
  return finishrawget(L, tag);
}